

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_traits.h
# Opt level: O0

void google::protobuf::json_internal::ParseProto2Descriptor::SetInt64(Field f,Msg *msg,int64_t x)

{
  bool bVar1;
  Reflection *pRVar2;
  int64_t x_local;
  Msg *msg_local;
  Field f_local;
  
  RecordAsSeen(f,msg);
  bVar1 = FieldDescriptor::is_repeated(f);
  if (bVar1) {
    pRVar2 = Message::GetReflection(msg->msg_);
    Reflection::AddInt64(pRVar2,msg->msg_,f,x);
  }
  else {
    pRVar2 = Message::GetReflection(msg->msg_);
    Reflection::SetInt64(pRVar2,msg->msg_,f,x);
  }
  return;
}

Assistant:

static void SetInt64(Field f, Msg& msg, int64_t x) {
    RecordAsSeen(f, msg);
    if (f->is_repeated()) {
      msg.msg_->GetReflection()->AddInt64(msg.msg_, f, x);
    } else {
      msg.msg_->GetReflection()->SetInt64(msg.msg_, f, x);
    }
  }